

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void plot_interior_tiles(tgestate_t *state)

{
  int iVar1;
  uint8_t *window_buf2;
  tilerow_t *tile_data;
  int stride;
  int iters;
  int columncounter;
  int rowcounter;
  interiortileindex_t *tiles_buf;
  uint8_t *window_buf;
  int columns;
  int rows;
  tgestate_t *state_local;
  
  rowcounter = state->rows + -1;
  iVar1 = state->columns;
  window_buf = state->window_buf;
  tiles_buf = state->tile_buf;
  columncounter = iVar1;
  do {
    do {
      window_buf2 = window_buf;
      iters = 8;
      tile_data = interior_tiles[*tiles_buf].row;
      do {
        *window_buf2 = *tile_data;
        window_buf2 = window_buf2 + iVar1;
        iters = iters + -1;
        tile_data = tile_data + 1;
      } while (iters != 0);
      tiles_buf = tiles_buf + 1;
      window_buf = window_buf + 1;
      columncounter = columncounter + -1;
    } while (columncounter != 0);
    window_buf = window_buf + iVar1 * 7;
    rowcounter = rowcounter + -1;
    columncounter = iVar1;
  } while (rowcounter != 0);
  return;
}

Assistant:

void plot_interior_tiles(tgestate_t *state)
{
  int                        rows;          /* added */
  int                        columns;       /* added */
  uint8_t                   *window_buf;    /* was HL */
  const interiortileindex_t *tiles_buf;     /* was DE */
  int                        rowcounter;    /* was C */
  int                        columncounter; /* was B */
  int                        iters;         /* was B */
  int                        stride;        /* was C */

  assert(state != NULL);

  rows       = state->rows - 1; // 16
  columns    = state->columns; // 24

  window_buf = state->window_buf;
  tiles_buf  = state->tile_buf; // note: type is coerced

  rowcounter = rows;
  do
  {
    columncounter = columns;
    do
    {
      const tilerow_t *tile_data;   /* was HL */
      uint8_t         *window_buf2; /* was DE */

      ASSERT_TILE_BUF_PTR_VALID(tiles_buf);

      tile_data = &interior_tiles[*tiles_buf].row[0];

      window_buf2 = window_buf;

      iters  = 8;
      stride = columns;
      do
      {
        ASSERT_WINDOW_BUF_PTR_VALID(window_buf2, 0);
        ASSERT_INTERIOR_TILES_VALID(tile_data);

        *window_buf2 = *tile_data++;
        window_buf2 += stride;
      }
      while (--iters);

      tiles_buf++;
      window_buf++; // move to next character position
    }
    while (--columncounter);
    window_buf += 7 * columns; // move to next row
  }
  while (--rowcounter);
}